

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaVCheckCVCSimpleType
              (xmlSchemaAbstractCtxtPtr actxt,xmlNodePtr node,xmlSchemaTypePtr type,xmlChar *value,
              xmlSchemaValPtr *retVal,int fireErrors,int normalize,int isNormalized)

{
  xmlSchemaTypePtr *ppxVar1;
  uint uVar2;
  xmlSchemaTypeType xVar3;
  bool bVar4;
  uint valNeeded;
  xmlParserErrors error;
  int iVar5;
  int iVar6;
  xmlParserErrors xVar7;
  xmlChar *pxVar8;
  undefined4 extraout_var;
  xmlSchemaValPtr *ppxVar9;
  xmlChar *pxVar10;
  xmlSchemaTypePtr item;
  xmlSchemaValPtr *ppxVar11;
  xmlNodePtr node_00;
  xmlSchemaValPtr *ppxVar12;
  char *message;
  ulong uVar13;
  xmlSchemaPtr schema;
  xmlSchemaValidCtxtPtr vctxt;
  char *pcVar14;
  uint displayValue;
  undefined4 in_register_0000008c;
  undefined8 uVar15;
  xmlSchemaValPtr pxVar16;
  xmlSchemaTypeLinkPtr pxVar17;
  long lVar18;
  byte bVar19;
  xmlSchemaTypePtr pxVar20;
  unsigned_long length;
  xmlSchemaValPtr *local_a8;
  xmlSchemaValPtr val;
  xmlSchemaValPtr *local_78;
  undefined8 local_70;
  xmlSchemaValPtr curVal;
  ulong local_60;
  xmlSchemaValPtr *local_58;
  uint local_4c;
  undefined8 local_48;
  xmlSchemaTypePtr local_40;
  xmlSchemaValPtr local_38;
  
  uVar15 = CONCAT44(in_register_0000008c,fireErrors);
  val = (xmlSchemaValPtr)0x0;
  pcVar14 = (char *)retVal;
  local_70 = uVar15;
  if (retVal == (xmlSchemaValPtr *)0x0) {
    bVar19 = (*(byte *)((long)&type->flags + 2) & 0x20) >> 5 | retVal != (xmlSchemaValPtr *)0x0;
  }
  else {
    bVar19 = 1;
    if (*retVal != (xmlSchemaValPtr)0x0) {
      xmlSchemaFreeValue(*retVal);
      *retVal = (xmlSchemaValPtr)0x0;
    }
  }
  displayValue = (uint)uVar15;
  valNeeded = (uint)bVar19;
  local_a8 = (xmlSchemaValPtr *)0x1e121f;
  if (value != (xmlChar *)0x0) {
    local_a8 = (xmlSchemaValPtr *)value;
  }
  if (((type->type == XML_SCHEMA_TYPE_BASIC) && (type->builtInType == 0x2e)) ||
     (uVar2 = type->flags, (uVar2 >> 8 & 1) != 0)) {
    if ((isNormalized == 0) && ((normalize != 0 || ((type->flags & 0x10000000) != 0)))) {
      ppxVar11 = (xmlSchemaValPtr *)xmlSchemaNormalizeValue(type,(xmlChar *)local_a8);
      if (ppxVar11 != (xmlSchemaValPtr *)0x0) {
        local_a8 = ppxVar11;
      }
    }
    else {
      ppxVar11 = (xmlSchemaValPtr *)0x0;
    }
    xVar3 = type->type;
    pxVar20 = type;
    while (xVar3 != XML_SCHEMA_TYPE_BASIC) {
      pxVar20 = pxVar20->baseType;
      if (pxVar20 == (xmlSchemaTypePtr)0x0) {
        error = XML_ERR_OK;
        xmlSchemaInternalErr2
                  (actxt,"xmlSchemaVCheckCVCSimpleType","could not get the built-in type",
                   (xmlChar *)0x0,(xmlChar *)pcVar14);
        bVar4 = false;
        goto LAB_0018dc6f;
      }
      xVar3 = pxVar20->type;
    }
    if (actxt->type == 1) {
      if (pxVar20->builtInType != 0x1c) {
LAB_0018d692:
        if (valNeeded == 0) {
          ppxVar12 = (xmlSchemaValPtr *)0x0;
        }
        else {
          ppxVar12 = &val;
        }
        xVar7 = xmlSchemaValPredefTypeNodeNoNorm(pxVar20,(xmlChar *)local_a8,ppxVar12,node);
        goto LAB_0018d8f7;
      }
      schema = *(xmlSchemaPtr *)(actxt + 4);
      vctxt = (xmlSchemaValidCtxtPtr)0x0;
      node_00 = node;
LAB_0018d67f:
      pcVar14 = (char *)&val;
      displayValue = valNeeded;
      xVar7 = xmlSchemaValidateNotation
                        (vctxt,schema,node_00,(xmlChar *)local_a8,(xmlSchemaValPtr *)pcVar14,
                         valNeeded);
LAB_0018d8f7:
      if (xVar7 == XML_ERR_OK) {
        error = XML_ERR_OK;
      }
      else {
        if ((int)xVar7 < 0) {
          message = "validating against a built-in type";
          error = xVar7;
          goto LAB_0018d961;
        }
        error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2 - ((type->flags & 0x40) == 0);
      }
      if ((xVar7 == XML_ERR_OK) && ((type->flags & 0x8000000) != 0)) {
        iVar5 = xmlSchemaValidateFacets
                          (actxt,node,type,pxVar20->builtInType,(xmlChar *)local_a8,val,0,
                           (int)local_70);
        bVar4 = true;
        if (iVar5 == 0) {
          error = XML_ERR_OK;
        }
        else if (iVar5 < 0) {
          bVar4 = false;
          xmlSchemaInternalErr2
                    (actxt,"xmlSchemaVCheckCVCSimpleType","validating facets of atomic simple type",
                     (xmlChar *)0x0,(xmlChar *)local_a8);
          error = ~XML_ERR_OK;
        }
        else {
          error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2 - ((type->flags & 0x40) == 0);
        }
      }
      else {
        bVar4 = true;
        if (((int)local_70 != 0) && (xVar7 != XML_ERR_OK)) {
          xmlSchemaSimpleTypeErr(actxt,error,node,(xmlChar *)local_a8,type,displayValue);
        }
      }
    }
    else {
      error = XML_ERR_OK;
      bVar4 = false;
      if (actxt->type == 2) {
        if (pxVar20->builtInType != 0x15) {
          if (pxVar20->builtInType != 0x1c) goto LAB_0018d692;
          schema = (xmlSchemaPtr)actxt[2].dummy;
          node_00 = (xmlNodePtr)0x0;
          vctxt = (xmlSchemaValidCtxtPtr)actxt;
          goto LAB_0018d67f;
        }
        curVal = (xmlSchemaValPtr)0x0;
        iVar5 = xmlValidateQName((xmlChar *)local_a8,1);
        if (iVar5 == 0) {
          ppxVar9 = (xmlSchemaValPtr *)xmlSchemaCollapseString((xmlChar *)local_a8);
          ppxVar12 = ppxVar9;
          if (ppxVar9 == (xmlSchemaValPtr *)0x0) {
            ppxVar12 = local_a8;
          }
          pxVar8 = xmlSplitQName2((xmlChar *)ppxVar12,(xmlChar **)&curVal);
          (*xmlFree)(ppxVar9);
          if (pxVar8 == (xmlChar *)0x0) {
            pxVar8 = xmlStrdup((xmlChar *)local_a8);
          }
          pxVar10 = xmlSchemaLookupNamespace((xmlSchemaValidCtxtPtr)actxt,(xmlChar *)curVal);
          if ((curVal == (xmlSchemaValPtr)0x0) || ((*xmlFree)(curVal), pxVar10 != (xmlChar *)0x0)) {
            if (valNeeded == 0) {
              (*xmlFree)(pxVar8);
            }
            else {
              if (pxVar10 == (xmlChar *)0x0) {
                xVar7 = XML_ERR_OK;
                val = xmlSchemaNewQNameValue((xmlChar *)0x0,pxVar8);
                goto LAB_0018d8f7;
              }
              pxVar10 = xmlStrdup(pxVar10);
              val = xmlSchemaNewQNameValue(pxVar10,pxVar8);
            }
            xVar7 = XML_ERR_OK;
          }
          else {
            item = xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME);
            pcVar14 = "The QName value \'%s\' has no corresponding namespace declaration in scope";
            xVar7 = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
            ppxVar12 = local_a8;
            xmlSchemaCustomErr4(actxt,XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1,(xmlNodePtr)0x0,
                                (xmlSchemaBasicItemPtr)item,
                                "The QName value \'%s\' has no corresponding namespace declaration in scope"
                                ,(xmlChar *)local_a8,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            displayValue = (uint)ppxVar12;
            if (pxVar8 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar8);
            }
          }
        }
        else {
          xVar7 = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
          if (iVar5 == -1) {
            xmlSchemaInternalErr2
                      (actxt,"xmlSchemaValidateQName","calling xmlValidateQName()",(xmlChar *)0x0,
                       (xmlChar *)pcVar14);
            xVar7 = ~XML_ERR_OK;
          }
        }
        goto LAB_0018d8f7;
      }
    }
LAB_0018dc6f:
    if (!bVar4) {
LAB_0018dcd2:
      if (ppxVar11 != (xmlSchemaValPtr *)0x0) {
        (*xmlFree)(ppxVar11);
      }
      error = ~XML_ERR_OK;
      goto LAB_0018dced;
    }
  }
  else {
    if ((uVar2 & 0x40) != 0) {
      curVal = (xmlSchemaValPtr)0x0;
      if (isNormalized == 0) {
        if ((uVar2 & 0x10000000) == 0 && normalize == 0) {
          local_48 = 1;
          goto LAB_0018d62e;
        }
        local_78 = retVal;
        local_58 = (xmlSchemaValPtr *)xmlSchemaNormalizeValue(type,(xmlChar *)local_a8);
        if (local_58 != (xmlSchemaValPtr *)0x0) {
          local_a8 = local_58;
        }
        local_48 = 0;
      }
      else {
        local_48 = 0;
LAB_0018d62e:
        local_58 = (xmlSchemaValPtr *)0x0;
        local_78 = retVal;
      }
      local_40 = type->subtypes;
      length = 0;
      local_38 = (xmlSchemaValPtr)0x0;
      ppxVar11 = local_a8;
      do {
        while( true ) {
          iVar5 = (int)uVar15;
          if ((0x20 < (ulong)*(byte *)ppxVar11) ||
             ((0x100002600U >> ((ulong)*(byte *)ppxVar11 & 0x3f) & 1) == 0)) break;
          ppxVar11 = (xmlSchemaValPtr *)((long)ppxVar11 + 1);
        }
        lVar18 = 0;
        while ((0x20 < (ulong)*(byte *)((long)ppxVar11 + lVar18) ||
               ((0x100002601U >> ((ulong)*(byte *)((long)ppxVar11 + lVar18) & 0x3f) & 1) == 0))) {
          lVar18 = lVar18 + 1;
        }
        local_4c = 0;
        bVar4 = true;
        if (lVar18 == 0) break;
        pxVar8 = xmlStrndup((xmlChar *)ppxVar11,(int)lVar18);
        if (valNeeded == 0) {
          ppxVar12 = (xmlSchemaValPtr *)0x0;
        }
        else {
          ppxVar12 = &curVal;
        }
        uVar15 = local_70;
        iVar5 = xmlSchemaVCheckCVCSimpleType(actxt,node,local_40,pxVar8,ppxVar12,(int)local_70,0,1);
        local_60 = CONCAT44(extraout_var,iVar5);
        if (pxVar8 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar8);
        }
        uVar13 = local_60;
        if (curVal != (xmlSchemaValPtr)0x0) {
          if (val == (xmlSchemaValPtr)0x0) {
            val = curVal;
          }
          else {
            xmlSchemaValueAppend(local_38,curVal);
          }
          local_38 = curVal;
          curVal = (xmlSchemaValPtr)0x0;
        }
        iVar5 = (int)uVar15;
        length = length + 1;
        if ((int)uVar13 != 0) {
          if ((int)uVar13 < 0) {
            xmlSchemaInternalErr2
                      (actxt,"xmlSchemaVCheckCVCSimpleType","validating an item of list simple type"
                       ,(xmlChar *)0x0,(xmlChar *)ppxVar12);
            goto LAB_0018dcbf;
          }
          local_4c = 0x721;
          bVar4 = false;
          break;
        }
        ppxVar11 = (xmlSchemaValPtr *)((long)ppxVar11 + lVar18);
      } while (*(byte *)ppxVar11 != 0);
      uVar13 = (ulong)local_4c;
      if ((bVar4) && (uVar13 = 0, (type->flags & 0x8000000) != 0)) {
        uVar13 = 0;
        ppxVar11 = local_a8;
        pxVar16 = val;
        iVar6 = xmlSchemaValidateFacets
                          (actxt,node,type,XML_SCHEMAS_UNKNOWN,(xmlChar *)local_a8,val,length,
                           (int)local_70);
        iVar5 = (int)pxVar16;
        if ((iVar6 == 0) || (uVar13 = 0x721, -1 < iVar6)) goto LAB_0018d9d7;
        xmlSchemaInternalErr2
                  (actxt,"xmlSchemaVCheckCVCSimpleType","validating facets of list simple type",
                   (xmlChar *)0x0,(xmlChar *)ppxVar11);
        local_60 = 0xffffffff;
LAB_0018dcbf:
        bVar4 = false;
        ppxVar11 = local_58;
        retVal = local_78;
      }
      else {
LAB_0018d9d7:
        retVal = local_78;
        bVar4 = true;
        ppxVar11 = local_58;
        local_60 = uVar13;
        if (0 < (int)uVar13 && (int)local_70 != 0) {
          if (((char)local_48 != '\0') &&
             (ppxVar11 = (xmlSchemaValPtr *)xmlSchemaNormalizeValue(type,(xmlChar *)local_a8),
             ppxVar11 != (xmlSchemaValPtr *)0x0)) {
            local_a8 = ppxVar11;
          }
          xmlSchemaSimpleTypeErr
                    (actxt,(xmlParserErrors)local_60,node,(xmlChar *)local_a8,type,iVar5);
        }
      }
      error = (xmlParserErrors)local_60;
      if (bVar4) goto LAB_0018dc74;
      goto LAB_0018dcd2;
    }
    pxVar20 = type;
    if ((char)uVar2 < '\0') {
      do {
        if (pxVar20->type != XML_SCHEMA_TYPE_SIMPLE) break;
        pxVar17 = pxVar20->memberTypes;
        if (pxVar17 != (xmlSchemaTypeLinkPtr)0x0) goto LAB_0018d6d1;
        ppxVar1 = &pxVar20->baseType;
        pxVar20 = *ppxVar1;
      } while (*ppxVar1 != (xmlSchemaTypePtr)0x0);
      pxVar17 = (xmlSchemaTypeLinkPtr)0x0;
LAB_0018d6d1:
      if (pxVar17 == (xmlSchemaTypeLinkPtr)0x0) {
        error = XML_ERR_OK;
        local_78 = retVal;
        xmlSchemaInternalErr2
                  (actxt,"xmlSchemaVCheckCVCSimpleType","union simple type has no member types",
                   (xmlChar *)0x0,(xmlChar *)pcVar14);
LAB_0018db13:
        ppxVar11 = (xmlSchemaValPtr *)0x0;
        bVar4 = false;
        retVal = local_78;
        goto LAB_0018dc6f;
      }
      local_78 = retVal;
      do {
        ppxVar11 = &val;
        if (valNeeded == 0) {
          ppxVar11 = (xmlSchemaValPtr *)0x0;
        }
        iVar5 = 0;
        error = xmlSchemaVCheckCVCSimpleType
                          (actxt,node,pxVar17->type,(xmlChar *)local_a8,ppxVar11,0,1,0);
      } while ((0 < (int)error) && (pxVar17 = pxVar17->next, pxVar17 != (xmlSchemaTypeLinkPtr)0x0));
      if (error == XML_ERR_OK) {
        xVar7 = XML_ERR_OK;
      }
      else {
        xVar7 = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
        if ((int)error < 0) {
          xmlSchemaInternalErr2
                    (actxt,"xmlSchemaVCheckCVCSimpleType","validating members of union simple type",
                     (xmlChar *)0x0,(xmlChar *)ppxVar11);
          goto LAB_0018db13;
        }
      }
      if (error != XML_ERR_OK) {
LAB_0018db65:
        error = xVar7;
        ppxVar11 = (xmlSchemaValPtr *)0x0;
        retVal = local_78;
LAB_0018db70:
        bVar4 = true;
        if (error != XML_ERR_OK && (int)local_70 != 0) {
          xmlSchemaSimpleTypeErr(actxt,error,node,(xmlChar *)local_a8,type,iVar5);
        }
        goto LAB_0018dc6f;
      }
      error = XML_ERR_OK;
      xVar7 = XML_ERR_OK;
      if (((uint)type->flags >> 0x1b & 1) == 0) goto LAB_0018db65;
      if (isNormalized == 0) {
        if ((type->flags & 0x10000000U) == 0 && normalize == 0) {
          ppxVar11 = (xmlSchemaValPtr *)0x0;
        }
        else {
          ppxVar11 = (xmlSchemaValPtr *)xmlSchemaNormalizeValue(pxVar17->type,(xmlChar *)local_a8);
          if (ppxVar11 != (xmlSchemaValPtr *)0x0) {
            local_a8 = ppxVar11;
          }
        }
      }
      else {
        ppxVar11 = (xmlSchemaValPtr *)0x0;
      }
      retVal = local_78;
      pcVar14 = (char *)local_a8;
      pxVar16 = val;
      xVar7 = xmlSchemaValidateFacets
                        (actxt,node,type,XML_SCHEMAS_UNKNOWN,(xmlChar *)local_a8,val,0,(int)local_70
                        );
      iVar5 = (int)pxVar16;
      if ((xVar7 == XML_ERR_OK) || (error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3, -1 < (int)xVar7))
      goto LAB_0018db70;
      message = "validating facets of union simple type";
      error = xVar7;
LAB_0018d961:
      bVar4 = false;
      xmlSchemaInternalErr2
                (actxt,"xmlSchemaVCheckCVCSimpleType",message,(xmlChar *)0x0,(xmlChar *)pcVar14);
      goto LAB_0018dc6f;
    }
    error = XML_ERR_OK;
    ppxVar11 = (xmlSchemaValPtr *)0x0;
  }
LAB_0018dc74:
  if (ppxVar11 != (xmlSchemaValPtr *)0x0) {
    (*xmlFree)(ppxVar11);
  }
  if ((error == XML_ERR_OK) && (retVal != (xmlSchemaValPtr *)0x0)) {
    *retVal = val;
    return 0;
  }
LAB_0018dced:
  if (val != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(val);
  }
  return error;
}

Assistant:

static int
xmlSchemaVCheckCVCSimpleType(xmlSchemaAbstractCtxtPtr actxt,
			     xmlNodePtr node,
			     xmlSchemaTypePtr type,
			     const xmlChar *value,
			     xmlSchemaValPtr *retVal,
			     int fireErrors,
			     int normalize,
			     int isNormalized)
{
    int ret = 0, valNeeded = (retVal) ? 1 : 0;
    xmlSchemaValPtr val = NULL;
    /* xmlSchemaWhitespaceValueType ws; */
    xmlChar *normValue = NULL;

#define NORMALIZE(atype) \
    if ((! isNormalized) && \
    (normalize || (type->flags & XML_SCHEMAS_TYPE_NORMVALUENEEDED))) { \
	normValue = xmlSchemaNormalizeValue(atype, value); \
	if (normValue != NULL) \
	    value = normValue; \
	isNormalized = 1; \
    }

    if ((retVal != NULL) && (*retVal != NULL)) {
	xmlSchemaFreeValue(*retVal);
	*retVal = NULL;
    }
    /*
    * 3.14.4 Simple Type Definition Validation Rules
    * Validation Rule: String Valid
    */
    /*
    * 1 It is schema-valid with respect to that definition as defined
    * by Datatype Valid in [XML Schemas: Datatypes].
    */
    /*
    * 2.1 If The definition is ENTITY or is validly derived from ENTITY given
    * the empty set, as defined in Type Derivation OK (Simple) ($3.14.6), then
    * the string must be a `declared entity name`.
    */
    /*
    * 2.2 If The definition is ENTITIES or is validly derived from ENTITIES
    * given the empty set, as defined in Type Derivation OK (Simple) ($3.14.6),
    * then every whitespace-delimited substring of the string must be a `declared
    * entity name`.
    */
    /*
    * 2.3 otherwise no further condition applies.
    */
    if ((! valNeeded) && (type->flags & XML_SCHEMAS_TYPE_FACETSNEEDVALUE))
	valNeeded = 1;
    if (value == NULL)
	value = BAD_CAST "";
    if (WXS_IS_ANY_SIMPLE_TYPE(type) || WXS_IS_ATOMIC(type)) {
	xmlSchemaTypePtr biType; /* The built-in type. */
	/*
	* SPEC (1.2.1) "if {variety} is `atomic` then the string must `match`
	* a literal in the `lexical space` of {base type definition}"
	*/
	/*
	* Whitespace-normalize.
	*/
	NORMALIZE(type);
	if (type->type != XML_SCHEMA_TYPE_BASIC) {
	    /*
	    * Get the built-in type.
	    */
	    biType = type->baseType;
	    while ((biType != NULL) &&
		(biType->type != XML_SCHEMA_TYPE_BASIC))
		biType = biType->baseType;

	    if (biType == NULL) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "could not get the built-in type");
		goto internal_error;
	    }
	} else
	    biType = type;
	/*
	* NOTATIONs need to be processed here, since they need
	* to lookup in the hashtable of NOTATION declarations of the schema.
	*/
	if (actxt->type == XML_SCHEMA_CTXT_VALIDATOR) {
	    switch (biType->builtInType) {
		case XML_SCHEMAS_NOTATION:
		    ret = xmlSchemaValidateNotation(
			(xmlSchemaValidCtxtPtr) actxt,
			((xmlSchemaValidCtxtPtr) actxt)->schema,
			NULL, value, &val, valNeeded);
		    break;
		case XML_SCHEMAS_QNAME:
		    ret = xmlSchemaValidateQName((xmlSchemaValidCtxtPtr) actxt,
			value, &val, valNeeded);
		    break;
		default:
		    /* ws = xmlSchemaGetWhiteSpaceFacetValue(type); */
		    if (valNeeded)
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, &val, node);
		    else
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, NULL, node);
		    break;
	    }
	} else if (actxt->type == XML_SCHEMA_CTXT_PARSER) {
	    switch (biType->builtInType) {
		case XML_SCHEMAS_NOTATION:
		    ret = xmlSchemaValidateNotation(NULL,
			((xmlSchemaParserCtxtPtr) actxt)->schema, node,
			value, &val, valNeeded);
		    break;
		default:
		    /* ws = xmlSchemaGetWhiteSpaceFacetValue(type); */
		    if (valNeeded)
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, &val, node);
		    else
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, NULL, node);
		    break;
	    }
	} else {
	    /*
	    * Validation via a public API is not implemented yet.
	    */
	    goto internal_error;
	}
	if (ret != 0) {
	    if (ret < 0) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "validating against a built-in type");
		goto internal_error;
	    }
	    if (WXS_IS_LIST(type))
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
	    else
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	}
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * Check facets.
	    */
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		(xmlSchemaValType) biType->builtInType, value, val,
		0, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of atomic simple type");
		    goto internal_error;
		}
		if (WXS_IS_LIST(type))
		    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
		else
		    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	    }
	}
	else if (fireErrors && (ret > 0))
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
    } else if (WXS_IS_LIST(type)) {

	xmlSchemaTypePtr itemType;
	const xmlChar *cur, *end;
	xmlChar *tmpValue = NULL;
	unsigned long len = 0;
	xmlSchemaValPtr prevVal = NULL, curVal = NULL;
	/* 1.2.2 if {variety} is `list` then the string must be a sequence
	* of white space separated tokens, each of which `match`es a literal
	* in the `lexical space` of {item type definition}
	*/
	/*
	* Note that XML_SCHEMAS_TYPE_NORMVALUENEEDED will be set if
	* the list type has an enum or pattern facet.
	*/
	NORMALIZE(type);
	/*
	* VAL TODO: Optimize validation of empty values.
	* VAL TODO: We do not have computed values for lists.
	*/
	itemType = WXS_LIST_ITEMTYPE(type);
	cur = value;
	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    tmpValue = xmlStrndup(cur, end - cur);
	    len++;

	    if (valNeeded)
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node, itemType,
		    tmpValue, &curVal, fireErrors, 0, 1);
	    else
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node, itemType,
		    tmpValue, NULL, fireErrors, 0, 1);
	    FREE_AND_NULL(tmpValue);
	    if (curVal != NULL) {
		/*
		* Add to list of computed values.
		*/
		if (val == NULL)
		    val = curVal;
		else
		    xmlSchemaValueAppend(prevVal, curVal);
		prevVal = curVal;
		curVal = NULL;
	    }
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating an item of list simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
		break;
	    }
	    cur = end;
	} while (*cur != 0);
	FREE_AND_NULL(tmpValue);
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * Apply facets (pattern, enumeration).
	    */
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		XML_SCHEMAS_UNKNOWN, value, val,
		len, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of list simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
	    }
	}
	if (fireErrors && (ret > 0)) {
	    /*
	    * Report the normalized value.
	    */
	    normalize = 1;
	    NORMALIZE(type);
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
	}
    } else if (WXS_IS_UNION(type)) {
	xmlSchemaTypeLinkPtr memberLink;
	/*
	* TODO: For all datatypes `derived` by `union`  whiteSpace does
	* not apply directly; however, the normalization behavior of `union`
	* types is controlled by the value of whiteSpace on that one of the
	* `memberTypes` against which the `union` is successfully validated.
	*
	* This means that the value is normalized by the first validating
	* member type, then the facets of the union type are applied. This
	* needs changing of the value!
	*/

	/*
	* 1.2.3 if {variety} is `union` then the string must `match` a
	* literal in the `lexical space` of at least one member of
	* {member type definitions}
	*/
	memberLink = xmlSchemaGetUnionSimpleTypeMemberTypes(type);
	if (memberLink == NULL) {
	    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		"union simple type has no member types");
	    goto internal_error;
	}
	/*
	* Always normalize union type values, since we currently
	* cannot store the whitespace information with the value
	* itself; otherwise a later value-comparison would be
	* not possible.
	*/
	while (memberLink != NULL) {
	    if (valNeeded)
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node,
		    memberLink->type, value, &val, 0, 1, 0);
	    else
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node,
		    memberLink->type, value, NULL, 0, 1, 0);
	    if (ret <= 0)
		break;
	    memberLink = memberLink->next;
	}
	if (ret != 0) {
	    if (ret < 0) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "validating members of union simple type");
		goto internal_error;
	    }
	    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
	}
	/*
	* Apply facets (pattern, enumeration).
	*/
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * The normalization behavior of `union` types is controlled by
	    * the value of whiteSpace on that one of the `memberTypes`
	    * against which the `union` is successfully validated.
	    */
	    NORMALIZE(memberLink->type);
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		XML_SCHEMAS_UNKNOWN, value, val,
		0, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of union simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
	    }
	}
	if (fireErrors && (ret > 0))
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
    }

    if (normValue != NULL)
	xmlFree(normValue);
    if (ret == 0) {
	if (retVal != NULL)
	    *retVal = val;
	else if (val != NULL)
	    xmlSchemaFreeValue(val);
    } else if (val != NULL)
	xmlSchemaFreeValue(val);
    return (ret);
internal_error:
    if (normValue != NULL)
	xmlFree(normValue);
    if (val != NULL)
	xmlSchemaFreeValue(val);
    return (-1);
}